

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilClearTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::DepthStencilClearCase::iterate(DepthStencilClearCase *this)

{
  RenderContext *context;
  ulong uVar1;
  byte bVar2;
  undefined1 uVar3;
  int i;
  deUint32 dVar4;
  int iVar5;
  deUint32 dVar6;
  deBool dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  RenderTarget *pRVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Surface *pSVar13;
  NotSupportedError *this_00;
  TestError *this_01;
  undefined8 *puVar14;
  int *piVar15;
  uint uVar16;
  Clear *__cur;
  int x;
  long lVar17;
  int ndx_1;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  undefined8 *puVar24;
  int ndx;
  bool bVar25;
  float fVar26;
  float fVar27;
  Surface reference;
  RGBA threshold;
  float pos [12];
  PixelBufferAccess rowAccess;
  Vector<int,_4> res;
  Surface result;
  Surface local_e0;
  ulong local_c8;
  RGBA local_bc;
  undefined1 local_b8 [24];
  void *local_a0;
  float local_98;
  undefined1 *local_94;
  float local_8c;
  ConstPixelBufferAccess local_80;
  Vec4 local_58;
  Surface local_48;
  
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = pRVar11->m_width;
  iVar10 = pRVar11->m_height;
  tcu::Surface::Surface(&local_48,iVar5,iVar10);
  tcu::Surface::Surface(&local_e0,iVar5,iVar10);
  iVar5 = (pRVar11->m_pixelFormat).alphaBits;
  bVar2 = 8 - (char)(pRVar11->m_pixelFormat).redBits;
  uVar20 = 0;
  if (0 < iVar5) {
    uVar20 = 0x1000000 << (8U - (char)iVar5 & 0x1f);
  }
  uVar18 = 0x100 << (8U - (char)(pRVar11->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar2 & 0x1f);
  uVar20 = 0x10000 << (8U - (char)(pRVar11->m_pixelFormat).blueBits & 0x1f) | uVar18 | uVar20;
  uVar16 = 1 << (bVar2 & 0x1f) & 0xff;
  if (0xfd < uVar16) {
    uVar16 = 0xfe;
  }
  uVar18 = uVar18 >> 8 & 0xff;
  if (0xfd < uVar18) {
    uVar18 = 0xfe;
  }
  uVar21 = uVar20 >> 0x10 & 0xff;
  if (0xfd < uVar21) {
    uVar21 = 0xfe;
  }
  uVar20 = uVar20 >> 0x18;
  if (0xfd < uVar20) {
    uVar20 = 0xfe;
  }
  local_bc.m_value = uVar20 * 0x1000000 + (uVar21 << 0x10 | uVar18 << 8 | uVar16) + 0x1010101;
  if (((this->m_testDepth == true) && (pRVar11->m_depthBits == 0)) ||
     ((this->m_testStencil == true && (pRVar11->m_stencilBits == 0)))) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"No depth/stencil buffers",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
               ,0xd3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar20 = this->m_curIter;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  uVar20 = (uVar20 >> 0x10 ^ uVar20 ^ 0x3d) * 9;
  uVar18 = (uVar20 >> 4 ^ uVar20) * 0x27d4eb2d;
  uVar20 = *(uint *)CONCAT44(extraout_var,iVar5);
  uVar16 = ((uint *)CONCAT44(extraout_var,iVar5))[1];
  deRandom_init((deRandom *)local_b8,uVar18 >> 0xf ^ dVar4 ^ uVar18);
  lVar17 = (long)this->m_numClears;
  if (lVar17 == 0) {
    puVar12 = (undefined8 *)0x0;
    puVar14 = (undefined8 *)0x0;
  }
  else {
    if (this->m_numClears < 0) {
      std::__throw_length_error("vector::_M_default_append");
    }
    puVar12 = (undefined8 *)operator_new(lVar17 * 0x28);
    puVar14 = puVar12;
    lVar19 = lVar17;
    do {
      *(undefined4 *)((long)puVar14 + 0x24) = 0;
      *puVar14 = 0;
      *(undefined8 *)((long)puVar14 + 5) = 0;
      puVar14[2] = 0;
      puVar14[3] = 0;
      *(undefined1 *)(puVar14 + 4) = 0;
      puVar14 = puVar14 + 5;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
    puVar14 = puVar12 + lVar17 * 5;
  }
  if (puVar12 != puVar14) {
    puVar24 = puVar12;
    do {
      if (this->m_testScissor == true) {
        dVar4 = deRandom_getUint32((deRandom *)local_b8);
        uVar21 = dVar4 % uVar20;
        dVar4 = deRandom_getUint32((deRandom *)local_b8);
        uVar18 = dVar4 % uVar16;
        dVar4 = deRandom_getUint32((deRandom *)local_b8);
        dVar6 = deRandom_getUint32((deRandom *)local_b8);
        *(undefined1 *)((long)puVar24 + 0xc) = 1;
        *(uint *)(puVar24 + 2) = dVar4 % (uVar20 - uVar21);
        *(uint *)((long)puVar24 + 0x14) = dVar6 % (uVar16 - uVar18);
        *(uint *)(puVar24 + 3) = uVar21 + 1;
        *(uint *)((long)puVar24 + 0x1c) = uVar18 + 1;
      }
      else {
        *(undefined1 *)((long)puVar24 + 0xc) = 0;
      }
      fVar26 = deRandom_getFloat((deRandom *)local_b8);
      *(float *)((long)puVar24 + 4) = fVar26 * 1.4000001 + -0.2;
      dVar4 = deRandom_getUint32((deRandom *)local_b8);
      *(deUint32 *)(puVar24 + 1) = dVar4;
      bVar25 = true;
      if (this->m_masked == true) {
        dVar7 = deRandom_getBool((deRandom *)local_b8);
        bVar25 = dVar7 == 1;
      }
      *(bool *)(puVar24 + 4) = bVar25;
      dVar4 = 0xffffffff;
      if (this->m_masked == true) {
        dVar4 = deRandom_getUint32((deRandom *)local_b8);
      }
      *(deUint32 *)((long)puVar24 + 0x24) = dVar4;
      uVar8 = 0x400;
      if ((this->m_testDepth == true) && (uVar8 = 0x100, this->m_testStencil == true)) {
        dVar4 = deRandom_getUint32((deRandom *)local_b8);
        uVar8 = *(undefined4 *)(&DAT_01c18e20 + (ulong)(dVar4 % 3) * 4);
      }
      *(undefined4 *)puVar24 = uVar8;
      puVar24 = puVar24 + 5;
    } while (puVar24 != puVar14);
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var_00,iVar5);
  uVar8 = (**(code **)(lVar17 + 0xb48))((this->m_visProgram->m_program).m_program,"u_color");
  uVar9 = (**(code **)(lVar17 + 0x780))((this->m_visProgram->m_program).m_program,"a_position");
  local_c8 = CONCAT44(local_c8._4_4_,uVar9);
  (**(code **)(lVar17 + 0x1d0))(0x3f800000);
  (**(code **)(lVar17 + 0x208))(0);
  (**(code **)(lVar17 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar17 + 0x188))(0x4500);
  dVar4 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar4,"Before clears",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                  ,0x121);
  for (puVar24 = puVar12; puVar24 != puVar14; puVar24 = puVar24 + 5) {
    if (*(char *)((long)puVar24 + 0xc) == '\x01') {
      (**(code **)(lVar17 + 0x5e0))(0xc11);
      (**(code **)(lVar17 + 0x1290))
                (*(undefined4 *)(puVar24 + 2),*(undefined4 *)((long)puVar24 + 0x14),
                 *(undefined4 *)(puVar24 + 3),*(undefined4 *)((long)puVar24 + 0x1c));
    }
    (**(code **)(lVar17 + 0x1d0))(*(undefined4 *)((long)puVar24 + 4));
    (**(code **)(lVar17 + 0x208))(*(undefined4 *)(puVar24 + 1));
    (**(code **)(lVar17 + 0x4a8))(*(undefined1 *)(puVar24 + 4));
    (**(code **)(lVar17 + 0x12d8))(*(undefined4 *)((long)puVar24 + 0x24));
    (**(code **)(lVar17 + 0x188))(*(undefined4 *)puVar24);
    if (*(char *)((long)puVar24 + 0xc) == '\x01') {
      (**(code **)(lVar17 + 0x4e8))(0xc11);
    }
  }
  (**(code **)(lVar17 + 0x4a8))(1);
  (**(code **)(lVar17 + 0x12d8))(0xffffffff);
  dVar4 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar4,"After clears",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                  ,0x13e);
  (**(code **)(lVar17 + 0x1680))((this->m_visProgram->m_program).m_program);
  (**(code **)(lVar17 + 0x610))(local_c8 & 0xffffffff);
  if (this->m_testDepth != false) {
    (**(code **)(lVar17 + 0x5e0))(0xb71);
    (**(code **)(lVar17 + 0x4a0))(0x201);
    (**(code **)(lVar17 + 0x4a8))(0);
    iVar5 = 0;
    (**(code **)(lVar17 + 0x238))(0,0,1,0);
    do {
      local_b8._8_4_ = (float)iVar5 * 0.0625 + -1.0;
      local_b8._0_4_ = 0xbf800000;
      local_b8._4_4_ = 0xbf800000;
      local_b8._12_4_ = -0x40800000;
      local_b8._16_4_ = 0x3f800000;
      local_a0 = (void *)0xbf8000003f800000;
      local_94 = &DAT_3f8000003f800000;
      local_b8._20_4_ = local_b8._8_4_;
      local_98 = (float)local_b8._8_4_;
      local_8c = (float)local_b8._8_4_;
      (**(code **)(lVar17 + 0x15a0))(0,0,(float)iVar5 / 31.0,0x3f800000,uVar8);
      (**(code **)(lVar17 + 0x19f0))(local_c8 & 0xffffffff,3,0x1406,0,0,local_b8);
      (**(code **)(lVar17 + 0x568))(4,6,0x1401);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x20);
    (**(code **)(lVar17 + 0x4e8))(0xb71);
    (**(code **)(lVar17 + 0x4a8))(1);
    dVar4 = (**(code **)(lVar17 + 0x800))();
    glu::checkError(dVar4,"After depth visualization",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                    ,0x162);
  }
  if (this->m_testStencil == true) {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = 1 << (*(byte *)(CONCAT44(extraout_var_01,iVar5) + 0x1c) & 0x1f);
    iVar5 = iVar10 + 0x1f;
    if (-1 < iVar10) {
      iVar5 = iVar10;
    }
    (**(code **)(lVar17 + 0x5e0))(0xb90);
    (**(code **)(lVar17 + 0x12e8))(0x1e00,0x1e00,0x1e00);
    (**(code **)(lVar17 + 0x238))(0,1,0,0);
    iVar22 = 0;
    (**(code **)(lVar17 + 0x19f0))
              (local_c8 & 0xffffffff,2,0x1406,0,0,
               renderGL(tcu::Surface&,std::vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>>const&)
               ::pos);
    iVar10 = 0;
    do {
      (**(code **)(lVar17 + 0x12c8))(0x203,iVar22,0xff);
      (**(code **)(lVar17 + 0x15a0))(0,(float)iVar10 / 31.0,0,0x3f800000,uVar8);
      (**(code **)(lVar17 + 0x568))
                (4,6,0x1401,
                 &renderGL(tcu::Surface&,std::vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>>const&)
                  ::indices);
      iVar10 = iVar10 + 1;
      iVar22 = iVar22 + (iVar5 >> 5);
    } while (iVar10 != 0x20);
    (**(code **)(lVar17 + 0x4e8))(0xb90);
    dVar4 = (**(code **)(lVar17 + 0x800))();
    glu::checkError(dVar4,"After stencil visualization",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                    ,0x184);
  }
  (**(code **)(lVar17 + 0x238))(1,1,1,1);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_80.m_format.order = RGBA;
  local_80.m_format.type = UNORM_INT8;
  if ((void *)local_48.m_pixels.m_cap != (void *)0x0) {
    local_48.m_pixels.m_cap = (size_t)local_48.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_b8,&local_80.m_format,local_48.m_width,local_48.m_height,1,
             (void *)local_48.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_b8);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_80.m_format.order = RGBA;
  local_80.m_format.type = UNORM_INT8;
  if ((void *)local_e0.m_pixels.m_cap != (void *)0x0) {
    local_e0.m_pixels.m_cap = (size_t)local_e0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_b8,&local_80.m_format,local_e0.m_width,local_e0.m_height,1,
             (void *)local_e0.m_pixels.m_cap);
  local_58.m_data[0] = -1.7014636e+38;
  tcu::RGBA::toVec((RGBA *)&local_80);
  tcu::clear((PixelBufferAccess *)local_b8,(Vec4 *)&local_80);
  if (this->m_testDepth == true) {
    iVar10 = *(int *)(CONCAT44(extraout_var_02,iVar5) + 0x18);
    uVar20 = iVar10 << 0x1d | iVar10 - 8U >> 3;
    if (3 < uVar20) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Can\'t map depth buffer format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                 ,99);
      goto LAB_00feb807;
    }
    local_80.m_format = *(TextureFormat *)(&DAT_01c18e30 + (ulong)uVar20 * 8);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_b8,&local_80.m_format,local_e0.m_width,1,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_80,(TextureLevel *)local_b8);
    if (0 < local_e0.m_height) {
      iVar10 = 0;
      do {
        if (0 < local_80.m_size.m_data[0]) {
          iVar22 = 0;
          do {
            lVar17 = 0;
            do {
              local_58.m_data[lVar17] = 1.0;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&local_80,&local_58,iVar22,0,0);
            iVar22 = iVar22 + 1;
          } while (iVar22 < local_80.m_size.m_data[0]);
        }
        if (puVar12 != puVar14) {
          lVar17 = 0;
          puVar24 = puVar12;
          do {
            if (((*(byte *)((long)puVar24 + 1) & 1) != 0) && (*(char *)(puVar24 + 4) == '\x01')) {
              iVar23 = 0;
              piVar15 = &local_e0.m_height;
              pSVar13 = &local_e0;
              iVar22 = 0;
              if (*(char *)((long)puVar24 + 0xc) == '\x01') {
                piVar15 = (int *)((long)puVar12 + lVar17 * 0x28 + 0x1c);
                pSVar13 = (Surface *)(puVar12 + lVar17 * 5 + 3);
                iVar22 = *(int *)(puVar12 + lVar17 * 5 + 2);
                iVar23 = *(int *)((long)puVar12 + lVar17 * 0x28 + 0x14);
              }
              if (((iVar23 <= iVar10) && (iVar10 < iVar23 + *piVar15)) &&
                 (iVar23 = pSVar13->m_width, iVar22 < iVar23 + iVar22)) {
                do {
                  fVar26 = *(float *)((long)puVar24 + 4);
                  fVar27 = 1.0;
                  if (fVar26 <= 1.0) {
                    fVar27 = fVar26;
                  }
                  tcu::PixelBufferAccess::setPixDepth
                            ((PixelBufferAccess *)&local_80,
                             (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar27),iVar22,0,0);
                  iVar22 = iVar22 + 1;
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
              }
            }
            puVar24 = puVar24 + 5;
            lVar17 = lVar17 + 1;
          } while (puVar24 != puVar14);
        }
        if (0 < local_e0.m_width) {
          iVar22 = 0;
          do {
            fVar26 = tcu::ConstPixelBufferAccess::getPixDepth(&local_80,iVar22,0,0);
            fVar26 = floorf(fVar26 * 32.0);
            fVar26 = (fVar26 / 31.0) * 255.0;
            iVar23 = (int)(fVar26 + *(float *)(&DAT_01bbbf24 + (ulong)(fVar26 < 0.0) * 4));
            if (0xfe < iVar23) {
              iVar23 = 0xff;
            }
            if (iVar23 < 1) {
              iVar23 = 0;
            }
            *(char *)((long)local_e0.m_pixels.m_ptr +
                     (long)(local_e0.m_width * iVar10 + iVar22) * 4 + 2) = (char)iVar23;
            iVar22 = iVar22 + 1;
          } while (iVar22 < local_e0.m_width);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < local_e0.m_height);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b8);
  }
  if (this->m_testStencil == true) {
    iVar5 = *(int *)(CONCAT44(extraout_var_02,iVar5) + 0x1c);
    uVar20 = iVar5 << 0x1d | iVar5 - 8U >> 3;
    if (3 < uVar20) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Can\'t map depth buffer format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                 ,0x70);
LAB_00feb807:
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_80.m_format = (TextureFormat)(((ulong)uVar20 << 0x20) + 0x1e00000013);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_b8,&local_80.m_format,local_e0.m_width,1,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_80,(TextureLevel *)local_b8);
    uVar20 = 1 << ((byte)iVar5 & 0x1f);
    if (0 < local_e0.m_height) {
      iVar5 = 0;
      local_c8 = (ulong)(uVar20 >> 5);
      do {
        if (0 < local_80.m_size.m_data[0]) {
          iVar10 = 0;
          do {
            local_58.m_data[0] = 0.0;
            local_58.m_data[1] = 0.0;
            local_58.m_data[2] = 0.0;
            local_58.m_data[3] = 0.0;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&local_80,(IVec4 *)&local_58,iVar10,0,0);
            iVar10 = iVar10 + 1;
          } while (iVar10 < local_80.m_size.m_data[0]);
        }
        if (puVar12 != puVar14) {
          lVar17 = 0;
          puVar24 = puVar12;
          do {
            if (((*(byte *)((long)puVar24 + 1) & 4) != 0) && (*(int *)((long)puVar24 + 0x24) != 0))
            {
              iVar22 = 0;
              piVar15 = &local_e0.m_height;
              pSVar13 = &local_e0;
              iVar10 = 0;
              if (*(char *)((long)puVar24 + 0xc) == '\x01') {
                piVar15 = (int *)((long)puVar12 + lVar17 * 0x28 + 0x1c);
                pSVar13 = (Surface *)(puVar12 + lVar17 * 5 + 3);
                iVar10 = *(int *)(puVar12 + lVar17 * 5 + 2);
                iVar22 = *(int *)((long)puVar12 + lVar17 * 0x28 + 0x14);
              }
              if (((iVar22 <= iVar5) && (iVar5 < iVar22 + *piVar15)) &&
                 (iVar22 = pSVar13->m_width, iVar10 < iVar22 + iVar10)) {
                do {
                  uVar16 = tcu::ConstPixelBufferAccess::getPixStencil(&local_80,iVar10,0,0);
                  tcu::PixelBufferAccess::setPixStencil
                            ((PixelBufferAccess *)&local_80,
                             ((*(uint *)(puVar24 + 1) ^ uVar16) & *(uint *)((long)puVar24 + 0x24) ^
                             uVar16) & uVar20 - 1,iVar10,0,0);
                  iVar10 = iVar10 + 1;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
            }
            puVar24 = puVar24 + 5;
            lVar17 = lVar17 + 1;
          } while (puVar24 != puVar14);
        }
        uVar1 = local_c8;
        if (0 < local_e0.m_width) {
          iVar10 = 0;
          do {
            uVar16 = tcu::ConstPixelBufferAccess::getPixStencil(&local_80,iVar10,0,0);
            iVar22 = (int)(((float)((ulong)uVar16 / (uVar1 & 0xffffffff)) / 31.0) * 255.0 + 0.5);
            if (0xfe < iVar22) {
              iVar22 = 0xff;
            }
            uVar3 = (undefined1)iVar22;
            if (iVar22 < 1) {
              uVar3 = 0;
            }
            *(undefined1 *)
             ((long)local_e0.m_pixels.m_ptr + (long)(local_e0.m_width * iVar5 + iVar10) * 4 + 1) =
                 uVar3;
            iVar10 = iVar10 + 1;
          } while (iVar10 < local_e0.m_width);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_e0.m_height);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b8);
  }
  iVar10 = this->m_curIter + 1;
  iVar5 = this->m_numIters;
  bVar25 = tcu::pixelThresholdCompare
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      "Result","Image comparison result",&local_e0,&local_48,&local_bc,
                      (iVar10 != iVar5) + COMPARE_LOG_RESULT);
  if (!bVar25) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  this->m_curIter = this->m_curIter + 1;
  if (puVar12 != (undefined8 *)0x0) {
    operator_delete(puVar12,(long)puVar14 - (long)puVar12);
  }
  tcu::Surface::~Surface(&local_e0);
  tcu::Surface::~Surface(&local_48);
  return (uint)(iVar10 != iVar5 && bVar25);
}

Assistant:

DepthStencilClearCase::IterateResult DepthStencilClearCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	int							width			= renderTarget.getWidth();
	int							height			= renderTarget.getHeight();
	tcu::Surface				result			(width, height);
	tcu::Surface				reference		(width, height);
	tcu::RGBA					threshold		= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<Clear>				clears;

	if ((m_testDepth && renderTarget.getDepthBits() == 0) ||
		(m_testStencil && renderTarget.getStencilBits() == 0))
		throw tcu::NotSupportedError("No depth/stencil buffers", "", __FILE__, __LINE__);

	generateClears(clears, deStringHash(getName())^deInt32Hash(m_curIter));
	renderGL(result, clears);
	renderReference(reference, clears);

	bool	isLastIter		= m_curIter+1 == m_numIters;
	bool	isOk			= tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, isLastIter ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curIter += 1;
	return isLastIter || !isOk ? STOP : CONTINUE;
}